

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  initializer_list<unsigned_long> __l;
  initializer_list<bool> __l_00;
  TestSuite ts;
  allocator_type local_169;
  vector<bool,_std::allocator<bool>_> local_168;
  TestRange<bool> local_140;
  string local_108;
  string local_e8;
  unsigned_long local_c8 [4];
  TestRange<unsigned_long> local_a8;
  TestSuite local_70;
  
  TestSuite::TestSuite(&local_70,argc,argv);
  local_70.options.printTestMessage = false;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"buffer basic test","");
  local_c8[0] = 0x400;
  local_c8[1] = 0x8000;
  local_c8[2] = 0x10000;
  __l._M_len = 3;
  __l._M_array = local_c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168,__l,&local_169);
  local_a8.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a8.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168);
  local_a8.begin = 0;
  local_a8.end = 0;
  local_a8.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&local_70,&local_e8,buffer_test::buffer_basic_test,&local_a8);
  if (local_a8.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"buffer serializer test","");
  local_c8[0] = CONCAT62(local_c8[0]._2_6_,1);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_c8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_168,__l_00,(allocator_type *)&local_169);
  local_140.type = ARRAY;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_140.array,&local_168);
  local_140.begin = false;
  local_140.end = false;
  local_140.step = false;
  TestSuite::doTest<bool,int(*)(bool)>
            (&local_70,&local_108,buffer_test::buffer_serializer_test,&local_140);
  if (local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_140.array.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  TestSuite::~TestSuite(&local_70);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite ts(argc, argv);

    ts.options.printTestMessage = false;

    ts.doTest( "buffer basic test",
               buffer_basic_test,
               TestRange<size_t>( {1024, 0x8000, 0x10000} ) );

    ts.doTest( "buffer serializer test",
               buffer_serializer_test,
               TestRange<bool>( {true, false} ) );

    return 0;
}